

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_path_unmatched_inclusions_next_w(archive *_a,wchar_t **_p)

{
  int iVar1;
  wchar_t wVar2;
  void *v;
  wchar_t *local_20;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_unmatched_inclusions_next_w");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    wVar2 = match_list_unmatched_inclusions_next
                      ((archive_match *)_a,(match_list *)&_a[1].error_string,L'\0',&local_20);
    *_p = local_20;
  }
  return wVar2;
}

Assistant:

int
archive_match_path_unmatched_inclusions_next_w(struct archive *_a,
    const wchar_t **_p)
{
	struct archive_match *a;
	const void *v;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_unmatched_inclusions_next_w");
	a = (struct archive_match *)_a;

	r = match_list_unmatched_inclusions_next(a, &(a->inclusions), 0, &v);
	*_p = (const wchar_t *)v;
	return (r);
}